

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O2

void __thiscall bitio::bitio_stream::seek(bitio_stream *this,int64_t n)

{
  byte bVar1;
  uint64_t uVar2;
  char cVar3;
  uchar uVar4;
  uint uVar5;
  
  if (n != 0) {
    if (0 < n) {
      skip(this,n);
      return;
    }
    uVar5 = (uint)-n & 7;
    fseek((FILE *)this->file,(~((ulong)-n >> 3) + this->byte_index) - this->current_buffer_length,1)
    ;
    load_buffer(this);
    uVar2 = this->byte_index;
    this->byte_index = uVar2 + 1;
    bVar1 = this->bit_count;
    cVar3 = (char)uVar5;
    if ((long)(8 - (ulong)bVar1) < (long)(ulong)uVar5) {
      this->byte_index = uVar2;
      this->bit_buffer = this->byte_buffer[uVar2] << (8 - bVar1 & 0x1f);
      if (uVar2 == 0) {
        fseek((FILE *)this->file,~this->current_buffer_length,1);
        load_buffer(this);
        uVar2 = this->byte_index;
        this->byte_index = uVar2 + 1;
        this->bit_buffer = this->byte_buffer[uVar2] << (8 - this->bit_count & 0x1f);
      }
      lim_skip(this,'\b' - cVar3);
      return;
    }
    uVar4 = cVar3 + bVar1;
    this->bit_count = uVar4;
    this->bit_buffer = this->byte_buffer[uVar2] << (8 - uVar4 & 0x1f);
  }
  return;
}

Assistant:

void bitio_stream::seek(int64_t n) {
    if (n == 0) return;
    if (n > 0) {
        skip(n);
    } else {

        auto nbits = -n;
        auto nbytes = nbits >> 0x3;
        auto rbits = nbits & 0x7;

        int64_t al_offset = (int64_t) byte_index - (int64_t) nbytes - 1 - (int64_t) current_buffer_length;

        fseek(file, al_offset, SEEK_CUR);

        load_buffer();
        byte_index++;

        if (rbits <= 8 - bit_count) {
            bit_count += rbits;
            bit_buffer = byte_buffer[byte_index - 1];
            bit_buffer <<= 8 - bit_count;
        } else {
            bit_buffer = byte_buffer[--byte_index];
            bit_buffer <<= 8 - bit_count;

            if (byte_index == 0) {
                fseek(file, -1-(int64_t) current_buffer_length, SEEK_CUR);
                load_buffer();
                bit_buffer = byte_buffer[byte_index++];
                bit_buffer <<= 8 - bit_count;
            }

            lim_skip(8 - rbits);
        }

    }
}